

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int fits_img_stats_short
              (short *array,long nx,long ny,int nullcheck,short nullvalue,long *ngoodpix,
              short *minvalue,short *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  short sVar1;
  short sVar2;
  short *psVar3;
  double *pdVar4;
  ulong uVar5;
  double *arr;
  double *arr_00;
  double *__ptr;
  double *__base;
  double *__base_00;
  long lVar6;
  short sVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  ulong npix;
  size_t sVar27;
  ulong npix_00;
  size_t sVar28;
  short sVar29;
  short *psVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  size_t local_e8;
  short local_d2;
  long local_a8;
  size_t local_a0;
  size_t local_80;
  long local_78;
  long ngood;
  ulong local_58;
  double local_50;
  double xsigma;
  double xmean;
  double mean_1;
  
  xmean = 0.0;
  xsigma = 0.0;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    FnMeanSigma_short(array,ny * nx,nullcheck,nullvalue,&ngood,&xmean,&xsigma,status);
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (mean != (double *)0x0) {
      *mean = xmean;
    }
    if (sigma != (double *)0x0) {
      *sigma = xsigma;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar31 = 0.0;
    if (2 < nx) {
      psVar3 = (short *)calloc(nx,2);
      if (psVar3 == (short *)0x0) {
        *status = 0x71;
      }
      else {
        pdVar4 = (double *)calloc(ny,8);
        if (pdVar4 != (double *)0x0) {
          lVar16 = 0;
          lVar6 = 0;
          if (0 < ny) {
            lVar6 = ny;
          }
          local_e8 = 0;
          psVar30 = array;
          for (; lVar16 != lVar6; lVar16 = lVar16 + 1) {
            if (nullcheck == 0) {
              sVar29 = array[lVar16 * nx];
              lVar14 = 0;
LAB_001a4c02:
              npix_00 = 0;
              while (lVar10 = lVar14 + 1, lVar10 < nx) {
                if (nullcheck == 0) {
                  sVar26 = (array + lVar16 * nx)[lVar14 + 1];
                }
                else {
                  while( true ) {
                    if (nx <= lVar10) goto LAB_001a4c40;
                    sVar26 = psVar30[lVar10];
                    if (sVar26 != nullvalue) break;
                    lVar10 = lVar10 + 1;
                  }
                }
                psVar3[npix_00] = sVar29 - sVar26;
                npix_00 = npix_00 + 1;
                lVar14 = lVar10;
                sVar29 = sVar26;
              }
LAB_001a4c40:
              if (1 < npix_00) {
                FnMeanSigma_short(psVar3,npix_00,0,0,(long *)0x0,&mean_1,&local_50,status);
                if (0.0 < local_50) {
                  for (iVar13 = 0; iVar13 != 3; iVar13 = iVar13 + 1) {
                    uVar5 = 0;
                    if (0 < (long)npix_00) {
                      uVar5 = npix_00;
                    }
                    npix = 0;
                    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                      if (ABS((double)(int)psVar3[uVar8] - mean_1) < local_50 * 5.0) {
                        if ((long)npix < (long)uVar8) {
                          psVar3[npix] = psVar3[uVar8];
                        }
                        npix = npix + 1;
                      }
                    }
                    if (npix == npix_00) break;
                    FnMeanSigma_short(psVar3,npix,0,0,(long *)0x0,&mean_1,&local_50,status);
                    npix_00 = npix;
                  }
                }
                pdVar4[local_e8] = local_50;
                local_e8 = local_e8 + 1;
              }
            }
            else {
              for (lVar14 = 0; nx != lVar14; lVar14 = lVar14 + 1) {
                sVar29 = psVar30[lVar14];
                if (sVar29 != nullvalue) goto LAB_001a4c02;
              }
            }
            psVar30 = psVar30 + nx;
          }
          if (local_e8 == 0) {
            dVar31 = 0.0;
          }
          else if (local_e8 == 1) {
            dVar31 = *pdVar4;
          }
          else {
            qsort(pdVar4,local_e8,8,FnCompare_double);
            dVar31 = (pdVar4[(long)(local_e8 - 1) / 2] + pdVar4[(long)local_e8 / 2]) * 0.5;
          }
          dVar31 = dVar31 * 0.70710678;
          free(pdVar4);
          free(psVar3);
          goto LAB_001a4eb3;
        }
        free(psVar3);
        *status = 0x71;
      }
      dVar31 = 0.0;
    }
LAB_001a4eb3:
    *noise1 = dVar31;
  }
  if ((minvalue == (short *)0x0 && maxvalue == (short *)0x0) && noise3 == (double *)0x0)
  goto LAB_001a574b;
  sVar27 = 1;
  if (nx < 9) {
    sVar27 = ny;
    ny = 1;
  }
  sVar27 = sVar27 * nx;
  if ((long)sVar27 < 9) {
    ngood = 0;
    if ((long)sVar27 < 1) {
      sVar27 = ngood;
    }
    sVar26 = -0x8000;
    sVar29 = 0x7fff;
    for (sVar9 = 0; sVar27 != sVar9; sVar9 = sVar9 + 1) {
      sVar21 = array[sVar9];
      if ((nullcheck == 0) || (sVar21 != nullvalue)) {
        if (sVar21 < sVar29) {
          sVar29 = sVar21;
        }
        if (sVar26 < sVar21) {
          sVar26 = sVar21;
        }
        ngood = ngood + 1;
      }
    }
    dVar31 = 0.0;
    dVar32 = 0.0;
    dVar33 = 0.0;
  }
  else {
    pdVar4 = (double *)calloc(sVar27,4);
    if (pdVar4 != (double *)0x0) {
      arr = (double *)calloc(sVar27,4);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(sVar27,4);
        if (arr_00 == (double *)0x0) {
          free(pdVar4);
          pdVar4 = arr;
        }
        else {
          __ptr = (double *)calloc(ny,8);
          if (__ptr == (double *)0x0) {
            free(pdVar4);
            free(arr);
            pdVar4 = arr_00;
          }
          else {
            __base = (double *)calloc(ny,8);
            if (__base == (double *)0x0) {
              free(pdVar4);
              free(arr);
              free(arr_00);
              pdVar4 = __ptr;
            }
            else {
              __base_00 = (double *)calloc(ny,8);
              if (__base_00 != (double *)0x0) {
                sVar9 = 0;
                if (ny < 1) {
                  ny = sVar9;
                }
                sVar26 = -0x8000;
                sVar29 = 0x7fff;
                local_a0 = 0;
                local_80 = 0;
                psVar3 = array;
                for (sVar28 = 0; sVar28 != ny; sVar28 = sVar28 + 1) {
                  if (nullcheck == 0) {
                    sVar11 = 0;
LAB_001a5044:
                    if (sVar11 != sVar27) {
                      lVar6 = sVar28 * sVar27;
                      local_d2 = array[lVar6 + sVar11];
                      if (local_d2 < sVar29) {
                        sVar29 = local_d2;
                      }
                      sVar21 = local_d2;
                      if (local_d2 <= sVar26) {
                        sVar21 = sVar26;
                      }
                      sVar11 = sVar11 + 1;
                      sVar12 = sVar11;
                      if (nullcheck != 0) {
                        sVar15 = sVar11;
                        if (sVar27 - sVar11 != 0 && (long)sVar11 <= (long)sVar27) {
                          sVar15 = sVar27;
                        }
                        for (; (sVar12 = sVar15, (long)sVar11 < (long)sVar27 &&
                               (sVar12 = sVar11, psVar3[sVar11] == nullvalue)); sVar11 = sVar11 + 1)
                        {
                        }
                      }
                      if (sVar12 == sVar27) {
                        sVar9 = sVar9 + 1;
                        sVar26 = sVar21;
                      }
                      else {
                        sVar7 = array[lVar6 + sVar12];
                        if (sVar7 < sVar29) {
                          sVar29 = sVar7;
                        }
                        sVar22 = sVar7;
                        if (sVar7 <= sVar21) {
                          sVar22 = sVar21;
                        }
                        sVar12 = sVar12 + 1;
                        sVar11 = sVar12;
                        if (nullcheck != 0) {
                          sVar15 = sVar12;
                          if (sVar27 - sVar12 != 0 && (long)sVar12 <= (long)sVar27) {
                            sVar15 = sVar27;
                          }
                          for (; (sVar11 = sVar15, (long)sVar12 < (long)sVar27 &&
                                 (sVar11 = sVar12, psVar3[sVar12] == nullvalue));
                              sVar12 = sVar12 + 1) {
                          }
                        }
                        if (sVar11 == sVar27) {
                          sVar9 = sVar9 + 2;
                          sVar26 = sVar22;
                        }
                        else {
                          sVar21 = array[lVar6 + sVar11];
                          if (sVar21 < sVar29) {
                            sVar29 = sVar21;
                          }
                          sVar26 = sVar21;
                          if (sVar21 <= sVar22) {
                            sVar26 = sVar22;
                          }
                          sVar11 = sVar11 + 1;
                          sVar12 = sVar11;
                          if (nullcheck != 0) {
                            sVar15 = sVar11;
                            if (sVar27 - sVar11 != 0 && (long)sVar11 <= (long)sVar27) {
                              sVar15 = sVar27;
                            }
                            for (; (sVar12 = sVar15, (long)sVar11 < (long)sVar27 &&
                                   (sVar12 = sVar11, psVar3[sVar11] == nullvalue));
                                sVar11 = sVar11 + 1) {
                            }
                          }
                          if (sVar12 == sVar27) {
                            sVar9 = sVar9 + 3;
                          }
                          else {
                            sVar22 = array[lVar6 + sVar12];
                            if (sVar22 < sVar29) {
                              sVar29 = sVar22;
                            }
                            sVar23 = sVar22;
                            if (sVar22 <= sVar26) {
                              sVar23 = sVar26;
                            }
                            sVar12 = sVar12 + 1;
                            sVar11 = sVar12;
                            if (nullcheck != 0) {
                              sVar15 = sVar12;
                              if (sVar27 - sVar12 != 0 && (long)sVar12 <= (long)sVar27) {
                                sVar15 = sVar27;
                              }
                              for (; (sVar11 = sVar15, (long)sVar12 < (long)sVar27 &&
                                     (sVar11 = sVar12, psVar3[sVar12] == nullvalue));
                                  sVar12 = sVar12 + 1) {
                              }
                            }
                            if (sVar11 == sVar27) {
                              sVar9 = sVar9 + 4;
                              sVar26 = sVar23;
                            }
                            else {
                              sVar1 = array[lVar6 + sVar11];
                              if (sVar1 < sVar29) {
                                sVar29 = sVar1;
                              }
                              sVar26 = sVar1;
                              if (sVar1 <= sVar23) {
                                sVar26 = sVar23;
                              }
                              sVar11 = sVar11 + 1;
                              sVar12 = sVar11;
                              if (nullcheck != 0) {
                                sVar15 = sVar11;
                                if (sVar27 - sVar11 != 0 && (long)sVar11 <= (long)sVar27) {
                                  sVar15 = sVar27;
                                }
                                for (; (sVar12 = sVar15, (long)sVar11 < (long)sVar27 &&
                                       (sVar12 = sVar11, psVar3[sVar11] == nullvalue));
                                    sVar11 = sVar11 + 1) {
                                }
                              }
                              if (sVar12 == sVar27) {
                                sVar9 = sVar9 + 5;
                              }
                              else {
                                sVar23 = array[lVar6 + sVar12];
                                if (sVar23 < sVar29) {
                                  sVar29 = sVar23;
                                }
                                sVar24 = sVar23;
                                if (sVar23 <= sVar26) {
                                  sVar24 = sVar26;
                                }
                                sVar12 = sVar12 + 1;
                                sVar11 = sVar12;
                                if (nullcheck != 0) {
                                  sVar15 = sVar12;
                                  if (sVar27 - sVar12 != 0 && (long)sVar12 <= (long)sVar27) {
                                    sVar15 = sVar27;
                                  }
                                  for (; (sVar11 = sVar15, (long)sVar12 < (long)sVar27 &&
                                         (sVar11 = sVar12, psVar3[sVar12] == nullvalue));
                                      sVar12 = sVar12 + 1) {
                                  }
                                }
                                if (sVar11 == sVar27) {
                                  sVar9 = sVar9 + 6;
                                  sVar26 = sVar24;
                                }
                                else {
                                  sVar2 = array[lVar6 + sVar11];
                                  if (sVar2 < sVar29) {
                                    sVar29 = sVar2;
                                  }
                                  sVar26 = sVar2;
                                  if (sVar2 <= sVar24) {
                                    sVar26 = sVar24;
                                  }
                                  sVar11 = sVar11 + 1;
                                  sVar12 = sVar11;
                                  if (nullcheck != 0) {
                                    sVar15 = sVar11;
                                    if (sVar27 - sVar11 != 0 && (long)sVar11 <= (long)sVar27) {
                                      sVar15 = sVar27;
                                    }
                                    for (; (sVar12 = sVar15, (long)sVar11 < (long)sVar27 &&
                                           (sVar12 = sVar11, psVar3[sVar11] == nullvalue));
                                        sVar11 = sVar11 + 1) {
                                    }
                                  }
                                  if (sVar12 == sVar27) {
                                    sVar9 = sVar9 + 7;
                                  }
                                  else {
                                    sVar24 = array[lVar6 + sVar12];
                                    lVar16 = sVar9 + 8;
                                    if (sVar24 < sVar29) {
                                      sVar29 = sVar24;
                                    }
                                    sVar25 = sVar24;
                                    if (sVar24 <= sVar26) {
                                      sVar25 = sVar26;
                                    }
                                    local_78 = 0;
                                    local_a8 = 0;
                                    while (sVar26 = sVar21, sVar21 = sVar22, sVar22 = sVar1,
                                          sVar20 = sVar24, sVar9 = sVar12 + 1,
                                          (long)sVar9 < (long)sVar27) {
                                      if (nullcheck == 0) {
                                        sVar24 = array[lVar6 + sVar12 + 1];
                                        sVar12 = sVar9;
                                      }
                                      else {
                                        while( true ) {
                                          if ((long)sVar27 <= (long)sVar9) goto LAB_001a54c7;
                                          sVar24 = psVar3[sVar9];
                                          sVar12 = sVar9;
                                          if (sVar24 != nullvalue) break;
                                          sVar9 = sVar9 + 1;
                                        }
                                      }
                                      if (sVar24 < sVar29) {
                                        sVar29 = sVar24;
                                      }
                                      if (sVar25 < sVar24) {
                                        sVar25 = sVar24;
                                      }
                                      uVar18 = (uint)sVar22;
                                      local_58 = (ulong)uVar18;
                                      if (sVar2 != sVar23 || sVar22 != sVar23) {
                                        iVar17 = uVar18 - (int)sVar2;
                                        iVar13 = -iVar17;
                                        if (0 < iVar17) {
                                          iVar13 = iVar17;
                                        }
                                        *(int *)((long)pdVar4 + local_78 * 4) = iVar13;
                                        local_78 = local_78 + 1;
                                      }
                                      sVar1 = sVar23;
                                      if ((((sVar26 == sVar21) && (sVar21 == sVar22)) &&
                                          (sVar22 == sVar23)) && (sVar23 == sVar2)) {
                                        lVar16 = lVar16 + 1;
                                        local_d2 = sVar7;
                                        sVar7 = sVar26;
                                        sVar23 = sVar2;
                                        sVar2 = sVar20;
                                      }
                                      else {
                                        iVar17 = (int)sVar2 + (int)sVar26;
                                        iVar19 = uVar18 * 2 - iVar17;
                                        iVar13 = -iVar19;
                                        if (0 < iVar19) {
                                          iVar13 = iVar19;
                                        }
                                        *(int *)((long)arr + local_a8 * 4) = iVar13;
                                        iVar17 = (int)local_d2 + uVar18 * 6 + iVar17 * -4 +
                                                 (int)sVar24;
                                        iVar13 = -iVar17;
                                        if (0 < iVar17) {
                                          iVar13 = iVar17;
                                        }
                                        *(int *)((long)arr_00 + local_a8 * 4) = iVar13;
                                        local_a8 = local_a8 + 1;
                                        local_d2 = sVar7;
                                        sVar7 = sVar26;
                                        sVar23 = sVar2;
                                        sVar2 = sVar20;
                                      }
                                    }
LAB_001a54c7:
                                    sVar9 = lVar16 + local_a8;
                                    sVar26 = sVar25;
                                    if (local_a8 != 0) {
                                      if (local_a8 == 1) {
                                        if (local_78 == 1) {
                                          __ptr[local_a0] = (double)*(int *)pdVar4;
                                          local_a0 = local_a0 + 1;
                                        }
                                        __base[local_80] = (double)*(int *)arr;
                                        iVar13 = *(int *)arr_00;
                                      }
                                      else {
                                        iVar13 = (int)local_a8;
                                        if (1 < local_78) {
                                          iVar17 = quick_select_int((int *)pdVar4,iVar13);
                                          __ptr[local_a0] = (double)iVar17;
                                          local_a0 = local_a0 + 1;
                                        }
                                        iVar17 = quick_select_int((int *)arr,iVar13);
                                        __base[local_80] = (double)iVar17;
                                        iVar13 = quick_select_int((int *)arr_00,iVar13);
                                      }
                                      __base_00[local_80] = (double)iVar13;
                                      local_80 = local_80 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    for (sVar11 = 0; sVar27 - sVar11 != 0; sVar11 = sVar11 + 1) {
                      if (psVar3[sVar11] != nullvalue) goto LAB_001a5044;
                    }
                  }
                  psVar3 = psVar3 + sVar27;
                }
                if (local_80 == 0) {
                  dVar31 = 0.0;
                  dVar32 = 0.0;
                }
                else if (local_80 == 1) {
                  dVar31 = *__base;
                  dVar32 = *__base_00;
                }
                else {
                  qsort(__base,local_80,8,FnCompare_double);
                  qsort(__base_00,local_80,8,FnCompare_double);
                  lVar6 = (long)(local_80 - 1) / 2;
                  dVar31 = (__base[(long)local_80 / 2] + __base[lVar6]) * 0.5;
                  dVar32 = (__base_00[(long)local_80 / 2] + __base_00[lVar6]) * 0.5;
                }
                if (local_a0 == 0) {
                  dVar33 = 0.0;
                }
                else if (local_a0 == 1) {
                  dVar33 = *__ptr;
                }
                else {
                  qsort(__ptr,local_a0,8,FnCompare_double);
                  dVar33 = (__ptr[(long)(local_a0 - 1) / 2] + __ptr[(long)local_a0 / 2]) * 0.5;
                }
                dVar33 = dVar33 * 1.0483579;
                dVar31 = dVar31 * 0.6052697;
                dVar32 = dVar32 * 0.1772048;
                ngood = sVar9;
                free(__base_00);
                free(__base);
                free(__ptr);
                free(arr_00);
                free(arr);
                free(pdVar4);
                goto LAB_001a56fe;
              }
              free(pdVar4);
              free(arr);
              free(arr_00);
              free(__ptr);
              pdVar4 = __base;
            }
          }
        }
      }
      free(pdVar4);
    }
    *status = 0x71;
    dVar31 = 0.0;
    dVar32 = 0.0;
    dVar33 = 0.0;
    sVar29 = 0;
    sVar26 = 0;
  }
LAB_001a56fe:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = ngood;
  }
  if (minvalue != (short *)0x0) {
    *minvalue = sVar29;
  }
  if (maxvalue != (short *)0x0) {
    *maxvalue = sVar26;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar33;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar31;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dVar32;
  }
LAB_001a574b:
  return *status;
}

Assistant:

int fits_img_stats_short(short *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	short nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	short *minvalue,    /* returned minimum non-null value in the array */
	short *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input short integer image.
*/
{
	long ngood;
	short minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_short(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_short(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_short(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}